

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsMeshFinalize(FmsMesh mesh)

{
  FmsIntType FVar1;
  FmsDomain pFVar2;
  ulong uVar3;
  size_t sVar4;
  void *pvVar5;
  FmsOrientation FVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  undefined1 *puVar11;
  FmsInt *pFVar12;
  int loc_face_id_1;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  FmsInt *pFVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  char cVar26;
  ulong uVar27;
  ulong uVar28;
  FmsOrientation *pFVar29;
  FmsInt *pFVar30;
  void *pvVar31;
  FmsInt FVar32;
  FmsOrientation *pFVar33;
  int i;
  bool bVar34;
  FmsInt aFStack_10208 [2041];
  undefined8 uStack_c240;
  FmsInt local_c208 [6144];
  FmsInt local_208 [9];
  ulong auStack_1c0 [3];
  FmsInt FStack_1a8;
  FmsInt tet_edges_sorted [4] [3];
  int aiStack_e8 [2];
  int nc [6];
  FmsOrientation *local_58;
  ulong local_40;
  
  if (mesh == (FmsMesh)0x0) {
    iVar7 = 1;
  }
  else {
    uVar25 = 0;
    while (iVar7 = 0, uVar25 < mesh->num_domains) {
      pFVar2 = mesh->domains[uVar25];
      uVar3 = pFVar2->num_entities[2];
      if (uVar3 != 0) {
        FVar1 = pFVar2->side_ids_type[2];
        if (FVar1 != pFVar2->side_ids_type[1]) {
          return 2;
        }
        sVar4 = FmsIntTypeSize[FVar1];
        pvVar5 = pFVar2->entities[1];
        pvVar31 = pFVar2->entities[2];
        pFVar29 = pFVar2->orientations[2];
        uVar18 = uVar3;
        for (uVar9 = 0; uVar9 < uVar3; uVar9 = uVar9 + 0x400) {
          FVar32 = 0x400;
          if (uVar18 < 0x400) {
            FVar32 = uVar18;
          }
          uStack_c240 = 0x104021;
          FmsEntitiesToSides(FVar1,3,0,3,pvVar31,2,pvVar5,6,0,local_c208,FVar32);
          iVar7 = FmsOrientFaceSides(3,FVar32,local_c208,pFVar29);
          if (iVar7 != 0) {
            return iVar7;
          }
          pFVar29 = pFVar29 + FVar32 * 3;
          pvVar31 = (void *)((long)pvVar31 + FVar32 * 3 * sVar4);
          uVar18 = uVar18 - 0x400;
        }
      }
      uVar3 = pFVar2->num_entities[3];
      if (uVar3 != 0) {
        FVar1 = pFVar2->side_ids_type[3];
        if (FVar1 != pFVar2->side_ids_type[1]) {
          return 2;
        }
        sVar4 = FmsIntTypeSize[FVar1];
        pvVar5 = pFVar2->entities[1];
        pvVar31 = pFVar2->entities[3];
        pFVar29 = pFVar2->orientations[3];
        uVar18 = uVar3;
        for (uVar9 = 0; uVar9 < uVar3; uVar9 = uVar9 + 0x400) {
          FVar32 = 0x400;
          if (uVar18 < 0x400) {
            FVar32 = uVar18;
          }
          FmsEntitiesToSides(FVar1,4,0,4,pvVar31,2,pvVar5,8,0,aFStack_10208,FVar32);
          iVar7 = FmsOrientFaceSides(4,FVar32,aFStack_10208,pFVar29);
          if (iVar7 != 0) {
            return iVar7;
          }
          pFVar29 = pFVar29 + FVar32 * 4;
          pvVar31 = (void *)((long)pvVar31 + FVar32 * 4 * sVar4);
          uVar18 = uVar18 - 0x400;
        }
      }
      uVar3 = pFVar2->num_entities[4];
      if (uVar3 != 0) {
        FVar1 = pFVar2->side_ids_type[4];
        if (FVar1 != pFVar2->side_ids_type[2]) {
          return 2;
        }
        sVar4 = FmsIntTypeSize[FVar1];
        pvVar5 = pFVar2->entities[2];
        pvVar31 = pFVar2->entities[4];
        pFVar29 = pFVar2->orientations[4];
        uVar9 = 0;
        uVar18 = uVar3;
        while( true ) {
          uVar28 = 0x200;
          if (uVar18 < 0x200) {
            uVar28 = uVar18;
          }
          uVar27 = uVar3 - uVar9;
          if (uVar3 < uVar9 || uVar27 == 0) break;
          if (0x1ff < uVar27) {
            uVar27 = 0x200;
          }
          uStack_c240 = 0x104299;
          FmsEntitiesToSides(FVar1,4,0,4,pvVar31,3,pvVar5,0xc,0,local_c208,uVar27);
          pFVar30 = local_c208;
          local_58 = pFVar29;
          for (uVar22 = 0; local_40 = uVar28, uVar22 != uVar27; uVar22 = uVar22 + 1) {
            for (lVar10 = 0x10; lVar10 != 0x70; lVar10 = lVar10 + 0x18) {
              uVar14 = *(ulong *)((long)pFVar30 + lVar10 + -0x10);
              uVar20 = *(ulong *)((long)pFVar30 + lVar10 + -8);
              uVar16 = *(ulong *)((long)pFVar30 + lVar10);
              if (uVar20 < uVar14) {
                if (uVar20 < uVar16) {
                  *(ulong *)((long)auStack_1c0 + lVar10 + 8) = uVar20;
                  if (uVar14 <= uVar16) {
                    *(ulong *)((long)auStack_1c0 + lVar10 + 0x10) = uVar14;
                    goto LAB_00104352;
                  }
                  *(ulong *)((long)auStack_1c0 + lVar10 + 0x10) = uVar16;
                }
                else {
                  *(ulong *)((long)auStack_1c0 + lVar10 + 8) = uVar16;
                  *(ulong *)((long)auStack_1c0 + lVar10 + 0x10) = uVar20;
                }
                *(ulong *)((long)tet_edges_sorted[-1] + lVar10 + 0x10) = uVar14;
              }
              else if (uVar16 < uVar20) {
                uVar15 = uVar16;
                if (uVar14 < uVar16) {
                  uVar15 = uVar14;
                }
                if (uVar16 < uVar14) {
                  uVar16 = uVar14;
                }
                *(ulong *)((long)auStack_1c0 + lVar10 + 8) = uVar15;
                *(ulong *)((long)auStack_1c0 + lVar10 + 0x10) = uVar16;
                *(ulong *)((long)tet_edges_sorted[-1] + lVar10 + 0x10) = uVar20;
              }
              else {
                *(ulong *)((long)auStack_1c0 + lVar10 + 8) = uVar14;
                *(ulong *)((long)auStack_1c0 + lVar10 + 0x10) = uVar20;
LAB_00104352:
                *(ulong *)((long)tet_edges_sorted[-1] + lVar10 + 0x10) = uVar16;
              }
            }
            pFVar12 = local_208;
            lVar10 = 0;
            while (lVar10 != 6) {
              iVar7 = FmsIntersectSorted(3,3,tet_edges_sorted
                                             [(long)(int)(&FmsOrientTetSides_tet_edge_face)
                                                         [lVar10 * 2] + -1] + 2,
                                         tet_edges_sorted
                                         [(long)(int)(&DAT_001115e4)[lVar10 * 2] + -1] + 2,pFVar12);
              aiStack_e8[lVar10] = iVar7;
              lVar10 = lVar10 + 1;
              pFVar12 = pFVar12 + 1;
              local_40 = uVar22;
              if (iVar7 == 0) goto LAB_00104521;
            }
            pFVar12 = pFVar30;
            for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
              if ((pFVar30[lVar10 * 3] != pFVar30[lVar10 * 3 + 1]) &&
                 (pFVar30[lVar10 * 3 + 1] != pFVar30[lVar10 * 3 + 2] &&
                  pFVar30[lVar10 * 3] != pFVar30[lVar10 * 3 + 2])) {
                if (aiStack_e8[(int)(&FmsOrientTetSides_tet_face_edge)[lVar10 * 3]] == 1) {
                  cVar26 = -2;
                  uVar13 = 0;
                  uVar8 = 1;
                  pFVar19 = pFVar12;
                  do {
                    cVar26 = cVar26 + '\x02';
                    uVar13 = uVar13 + 1;
                    uVar8 = uVar8 + 1;
                    FVar32 = *pFVar19;
                    pFVar19 = pFVar19 + 1;
                  } while (local_208[(int)(&FmsOrientTetSides_tet_face_edge)[lVar10 * 3]] != FVar32)
                  ;
                  if (aiStack_e8[(int)(&DAT_00111614)[lVar10 * 3]] == 1) {
                    bVar34 = pFVar30[lVar10 * 3 + (ulong)uVar13 % 3] ==
                             local_208[(int)(&DAT_00111614)[lVar10 * 3]];
                  }
                  else {
                    if (aiStack_e8[(int)(&DAT_00111618)[lVar10 * 3]] != 1) goto LAB_001044e5;
                    bVar34 = pFVar30[lVar10 * 3 + (ulong)uVar8 % 3] ==
                             local_208[(int)(&DAT_00111618)[lVar10 * 3]];
                  }
                  FVar6 = !bVar34 + cVar26;
                }
                else {
                  if ((aiStack_e8[(int)(&DAT_00111614)[lVar10 * 3]] != 1) ||
                     (aiStack_e8[(int)(&DAT_00111618)[lVar10 * 3]] != 1)) goto LAB_001044e5;
                  uVar14 = 0;
                  do {
                    uVar20 = uVar14;
                    uVar14 = uVar20 + 1;
                  } while (local_208[(int)(&DAT_00111614)[lVar10 * 3]] != pFVar12[uVar20]);
                  puVar11 = &GetTriangleOrientation_oo_24;
                  if (pFVar30[lVar10 * 3 +
                              (ulong)(uint)((int)((uVar14 & 0xffffffff) / 3) * -3 + (int)uVar14)] ==
                      local_208[(int)(&DAT_00111618)[lVar10 * 3]]) {
                    puVar11 = &GetTriangleOrientation_oo;
                  }
                  FVar6 = puVar11[uVar20];
                }
                if (FVar6 != 0xff) {
                  local_58[lVar10] = FVar6;
                }
              }
LAB_001044e5:
              pFVar12 = pFVar12 + 3;
            }
            pFVar30 = pFVar30 + 0xc;
            local_58 = local_58 + 4;
          }
LAB_00104521:
          if (local_40 < uVar27) {
            return 1;
          }
          pFVar29 = pFVar29 + uVar27 * 4;
          pvVar31 = (void *)((long)pvVar31 + uVar27 * 4 * sVar4);
          uVar9 = uVar9 + 0x200;
          uVar18 = uVar18 - 0x200;
        }
      }
      uVar3 = pFVar2->num_entities[5];
      if (uVar3 != 0) {
        FVar1 = pFVar2->side_ids_type[5];
        if (FVar1 != pFVar2->side_ids_type[3]) {
          return 2;
        }
        sVar4 = FmsIntTypeSize[FVar1];
        pvVar5 = pFVar2->entities[3];
        pvVar31 = pFVar2->entities[5];
        pFVar29 = pFVar2->orientations[5];
        uVar9 = 0;
        uVar18 = uVar3;
        while( true ) {
          uVar28 = 0x100;
          if (uVar18 < 0x100) {
            uVar28 = uVar18;
          }
          uVar27 = uVar3 - uVar9;
          if (uVar3 < uVar9 || uVar27 == 0) break;
          if (0xff < uVar27) {
            uVar27 = 0x100;
          }
          uStack_c240 = 0x104662;
          FmsEntitiesToSides(FVar1,6,0,6,pvVar31,4,pvVar5,0x18,0,local_c208,uVar27);
          pFVar30 = local_c208;
          pFVar33 = pFVar29;
          for (uVar22 = 0; uVar14 = uVar28, uVar22 != uVar27; uVar22 = uVar22 + 1) {
            for (lVar10 = 0x18; lVar10 != 0xd8; lVar10 = lVar10 + 0x20) {
              uVar14 = *(ulong *)((long)pFVar30 + lVar10 + -0x18);
              uVar20 = *(ulong *)((long)pFVar30 + lVar10 + -0x10);
              uVar16 = uVar20;
              if (uVar14 >= uVar20 && uVar14 != uVar20) {
                uVar16 = uVar14;
              }
              if (uVar14 < uVar20) {
                uVar20 = uVar14;
              }
              uVar14 = *(ulong *)((long)pFVar30 + lVar10 + -8);
              uVar15 = *(ulong *)((long)pFVar30 + lVar10);
              uVar21 = uVar15;
              if (uVar14 < uVar15) {
                uVar21 = uVar14;
              }
              if (uVar15 < uVar14) {
                uVar15 = uVar14;
              }
              if (uVar21 < uVar20) {
                *(ulong *)((long)auStack_1c0 + lVar10) = uVar21;
                if (uVar20 < uVar15) {
                  *(ulong *)((long)auStack_1c0 + lVar10 + 8) = uVar20;
                  if (uVar15 <= uVar16) goto LAB_001046fa;
LAB_001046d6:
                  *(ulong *)((long)auStack_1c0 + lVar10 + 0x10) = uVar16;
                  uVar16 = uVar15;
                }
                else {
                  *(ulong *)((long)auStack_1c0 + lVar10 + 8) = uVar15;
                  *(ulong *)((long)auStack_1c0 + lVar10 + 0x10) = uVar20;
                }
              }
              else {
                *(ulong *)((long)auStack_1c0 + lVar10) = uVar20;
                if (uVar21 < uVar16) {
                  *(ulong *)((long)auStack_1c0 + lVar10 + 8) = uVar21;
                  if (uVar16 <= uVar15) goto LAB_001046d6;
LAB_001046fa:
                  *(ulong *)((long)auStack_1c0 + lVar10 + 0x10) = uVar15;
                }
                else {
                  *(ulong *)((long)auStack_1c0 + lVar10 + 8) = uVar16;
                  *(ulong *)((long)auStack_1c0 + lVar10 + 0x10) = uVar21;
                  uVar16 = uVar15;
                }
              }
              *(ulong *)((long)tet_edges_sorted[-1] + lVar10 + 0x10) = uVar16;
            }
            pFVar12 = local_208;
            lVar10 = 0;
            while (lVar10 != 0xc) {
              iVar7 = FmsIntersectSorted(4,4,(FmsInt *)
                                             ((long)tet_edges_sorted +
                                             (long)(int)(&FmsOrientHexSides_hex_edge_face)
                                                        [lVar10 * 2] * 0x20 + -8),
                                         (FmsInt *)
                                         ((long)tet_edges_sorted +
                                         (long)(int)(&DAT_00111654)[lVar10 * 2] * 0x20 + -8),pFVar12
                                        );
              aiStack_e8[lVar10] = iVar7;
              lVar10 = lVar10 + 1;
              pFVar12 = pFVar12 + 1;
              uVar14 = uVar22;
              if (iVar7 == 0) goto LAB_001048a8;
            }
            pFVar12 = pFVar30;
            for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
              lVar17 = lVar10 * 0x20;
              if (((*(long *)((long)tet_edges_sorted + lVar17 + -8) !=
                    *(long *)((long)tet_edges_sorted + lVar17)) &&
                  (lVar23 = *(long *)((long)tet_edges_sorted + lVar17 + 8),
                  *(long *)((long)tet_edges_sorted + lVar17) != lVar23)) &&
                 (lVar23 != *(long *)((long)tet_edges_sorted + lVar17 + 0x10))) {
                lVar17 = lVar10 * 0x10;
                if (((aiStack_e8[*(int *)(FmsOrientHexSides_hex_face_edge + lVar17)] == 1) &&
                    (aiStack_e8[*(int *)(FmsOrientHexSides_hex_face_edge + lVar17 + 4)] == 1)) &&
                   ((aiStack_e8[*(int *)(FmsOrientHexSides_hex_face_edge + lVar17 + 8)] == 1 &&
                    (aiStack_e8[*(int *)(FmsOrientHexSides_hex_face_edge + lVar17 + 0xc)] == 1)))) {
                  cVar26 = '\0';
                  lVar23 = 0;
                  do {
                    lVar24 = lVar23 + 1;
                    cVar26 = cVar26 + -2;
                    pFVar19 = pFVar12 + lVar23;
                    lVar23 = lVar24;
                  } while (local_208[*(int *)(FmsOrientHexSides_hex_face_edge + lVar17)] != *pFVar19
                          );
                  if ((char)((pFVar30[lVar10 * 4 + (ulong)((uint)lVar24 & 3)] !=
                             local_208[*(int *)(FmsOrientHexSides_hex_face_edge + lVar17 + 4)]) + -1
                            ) != cVar26) {
                    pFVar33[lVar10] =
                         ((pFVar30[lVar10 * 4 + (ulong)((uint)lVar24 & 3)] !=
                          local_208[*(int *)(FmsOrientHexSides_hex_face_edge + lVar17 + 4)]) -
                         cVar26) + 0xfe;
                  }
                }
              }
              pFVar12 = pFVar12 + 4;
            }
            pFVar30 = pFVar30 + 0x18;
            pFVar33 = pFVar33 + 6;
          }
LAB_001048a8:
          if (uVar14 < uVar27) {
            return 1;
          }
          pFVar29 = pFVar29 + uVar27 * 6;
          pvVar31 = (void *)((long)pvVar31 + uVar27 * 6 * sVar4);
          uVar9 = uVar9 + 0x100;
          uVar18 = uVar18 - 0x100;
        }
      }
      if ((pFVar2->num_entities[6] != 0) || (uVar25 = uVar25 + 1, pFVar2->num_entities[7] != 0)) {
        FmsAbortNotImplemented();
      }
    }
  }
  return iVar7;
}

Assistant:

int FmsMeshFinalize(FmsMesh mesh) {
  if (!mesh) { E_RETURN(1); }
  // Generate the side entity orientations for all entities in all domains
  for (FmsInt domain_id = 0; domain_id < mesh->num_domains; domain_id++) {
    FmsDomain domain = mesh->domains[domain_id];
    // Triangles
    if (domain->num_entities[FMS_TRIANGLE]) {
      const FmsEntityType et = FMS_TRIANGLE;
      const FmsIntType side_ids_type = domain->side_ids_type[et];
      if (side_ids_type != domain->side_ids_type[FMS_EDGE]) { E_RETURN(2); }
      const size_t sizeof_side_ids = FmsIntTypeSize[side_ids_type];
      const FmsInt num_tri = domain->num_entities[et];
      const char *all_tris = domain->entities[et];
      const void *all_edges = domain->entities[FMS_EDGE];
      FmsOrientation *oris = domain->orientations[et];
      const int bsize = 1024;
      FmsInt tri_verts[6*bsize];
      for (FmsInt off = 0; off < num_tri; off += bsize) {
        const FmsInt sz = FmsIntMin(bsize, num_tri-off);
        FmsEntitiesToSides(side_ids_type, 3, 0, 3, all_tris, 2, all_edges,
                           6, 0, tri_verts, sz);
        int err = FmsOrientFaceSides(3, sz, tri_verts, oris);
        if (err) { E_RETURN(err); }
        // TODO: create/update a list of the unknown side orientations
        all_tris += 3*sz*sizeof_side_ids;
        oris += 3*sz;
      }
    }
    // Quads
    if (domain->num_entities[FMS_QUADRILATERAL]) {
      const FmsEntityType et = FMS_QUADRILATERAL;
      const FmsIntType side_ids_type = domain->side_ids_type[et];
      if (side_ids_type != domain->side_ids_type[FMS_EDGE]) { E_RETURN(2); }
      const size_t sizeof_side_ids = FmsIntTypeSize[side_ids_type];
      const FmsInt num_quads = domain->num_entities[et];
      const char *all_quads = domain->entities[et];
      const void *all_edges = domain->entities[FMS_EDGE];
      FmsOrientation *oris = domain->orientations[et];
      const int bsize = 1024;
      FmsInt quad_verts[8*bsize];
      for (FmsInt off = 0; off < num_quads; off += bsize) {
        const FmsInt sz = FmsIntMin(bsize, num_quads-off);
        FmsEntitiesToSides(side_ids_type, 4, 0, 4, all_quads, 2, all_edges,
                           8, 0, quad_verts, sz);
        int err = FmsOrientFaceSides(4, sz, quad_verts, oris);
        if (err) { E_RETURN(err); }
        // TODO: create/update a list of the unknown side orientations
        all_quads += 4*sz*sizeof_side_ids;
        oris += 4*sz;
      }
    }
    // Tets
    if (domain->num_entities[FMS_TETRAHEDRON]) {
      const FmsEntityType et = FMS_TETRAHEDRON;
      const FmsIntType side_ids_type = domain->side_ids_type[et];
      if (side_ids_type != domain->side_ids_type[FMS_TRIANGLE]) { E_RETURN(2); }
      const size_t sizeof_side_ids = FmsIntTypeSize[side_ids_type];
      const FmsInt num_tets = domain->num_entities[et];
      const char *all_tets = domain->entities[et];
      const void *all_tris = domain->entities[FMS_TRIANGLE];
      FmsOrientation *oris = domain->orientations[et];
      const int bsize = 512;
      FmsInt tet_edges[12*bsize];
      for (FmsInt off = 0; off < num_tets; off += bsize) {
        const FmsInt sz = FmsIntMin(bsize, num_tets-off);
        FmsEntitiesToSides(side_ids_type, 4, 0, 4, all_tets, 3, all_tris,
                           12, 0, tet_edges, sz);
        int err = FmsOrientTetSides(sz, tet_edges, oris);
        if (err) { E_RETURN(err); }
        // TODO: create/update a list of the unknown side orientations
        all_tets += 4*sz*sizeof_side_ids;
        oris += 4*sz;
      }
    }
    // Hexes
    if (domain->num_entities[FMS_HEXAHEDRON]) {
      const FmsEntityType et = FMS_HEXAHEDRON;
      const FmsIntType side_ids_type = domain->side_ids_type[et];
      if (side_ids_type != domain->side_ids_type[FMS_QUADRILATERAL]) {
        E_RETURN(2);
      }
      const size_t sizeof_side_ids = FmsIntTypeSize[side_ids_type];
      const FmsInt num_hexes = domain->num_entities[et];
      const char *all_hexes = domain->entities[et];
      const void *all_quads = domain->entities[FMS_QUADRILATERAL];
      FmsOrientation *oris = domain->orientations[et];
      const int bsize = 256;
      FmsInt hex_edges[24*bsize];
      for (FmsInt off = 0; off < num_hexes; off += bsize) {
        const FmsInt sz = FmsIntMin(bsize, num_hexes-off);
        FmsEntitiesToSides(side_ids_type, 6, 0, 6, all_hexes, 4, all_quads,
                           24, 0, hex_edges, sz);
        int err = FmsOrientHexSides(sz, hex_edges, oris);
        if (err) { E_RETURN(err); }
        // TODO: create/update a list of the unknown side orientations
        all_hexes += 6*sz*sizeof_side_ids;
        oris += 6*sz;
      }
    }
    // Wedges
    if (domain->num_entities[FMS_WEDGE]) {
      // TODO ...
      FmsAbortNotImplemented();
    }
    // Pyramids
    if (domain->num_entities[FMS_PYRAMID]) {
      // TODO ...
      FmsAbortNotImplemented();
    }
  }
  // TODO ...
  return 0;
}